

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O2

void __thiscall
cppnet::TimerContainer::GetIndexTimer
          (TimerContainer *this,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *run_timer_solts,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *sub_timer_solts,uint32_t index,uint32_t time_pass)

{
  iterator __it;
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  _Self __tmp;
  shared_ptr<cppnet::TimerSlot> target;
  uint32_t local_54;
  __shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2> local_50;
  __weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_54 = index;
  __it = std::
         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->_timer_wheel)._M_h,&local_54);
  if (__it.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    for (p_Var1 = *(_Rb_tree_node_base **)
                   ((long)__it.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
                          ._M_cur + 0x28);
        p_Var1 != (_Rb_tree_node_base *)
                  ((long)__it.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
                         ._M_cur + 0x18);
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      if (time_pass < p_Var1[1]._M_color) {
        p_Var2 = (_Base_ptr)&p_Var1[1]._M_parent;
        while (p_Var2 = *(_Base_ptr *)p_Var2, p_Var2 != (_Base_ptr)&p_Var1[1]._M_parent) {
          std::__shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_50,&p_Var2->_M_left);
          std::__weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2>::
          __weak_ptr<cppnet::TimerSlot,void>(local_40,&local_50);
          std::
          vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
          ::emplace_back<std::weak_ptr<cppnet::TimerSlot>>
                    ((vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
                      *)sub_timer_solts,(weak_ptr<cppnet::TimerSlot> *)local_40);
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        }
      }
      else {
        std::
        vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>::
        insert<std::_List_iterator<std::weak_ptr<cppnet::TimerSlot>>,void>
                  ((vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
                    *)run_timer_solts,
                   (run_timer_solts->
                   super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
                   (_List_node_base *)p_Var1[1]._M_parent,
                   (_List_iterator<std::weak_ptr<cppnet::TimerSlot>_>)&p_Var1[1]._M_parent);
      }
    }
    Bitmap::Remove(&this->_bitmap,this->_cur_time);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->_timer_wheel)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
            ._M_cur);
  }
  return;
}

Assistant:

void TimerContainer::GetIndexTimer(std::vector<std::weak_ptr<TimerSlot>>& run_timer_solts, 
    std::vector<std::weak_ptr<TimerSlot>>& sub_timer_solts, uint32_t index, uint32_t time_pass) {
    auto bucket_iter = _timer_wheel.find(index);
    if (bucket_iter == _timer_wheel.end()) {
        return;
    }
    auto& bucket = bucket_iter->second;

    for (auto timer_list = bucket.begin(); timer_list != bucket.end(); timer_list++) {
        if (timer_list->first == 0) {
            run_timer_solts.insert(run_timer_solts.end(), timer_list->second.begin(), timer_list->second.end());
            continue;
        }

        if (timer_list->first <= time_pass) {
            run_timer_solts.insert(run_timer_solts.end(), timer_list->second.begin(), timer_list->second.end());
            continue;
        }

        for (auto timer = timer_list->second.begin(); timer != timer_list->second.end(); timer++) {
            auto target = timer->lock();
            sub_timer_solts.push_back(target);
        }
    }

    _bitmap.Remove(_cur_time);
    _timer_wheel.erase(bucket_iter);
}